

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

void __thiscall QVariantAnimation::setDuration(QVariantAnimation *this,int msecs)

{
  parameter_type pVar1;
  QVariantAnimationPrivate *pQVar2;
  int in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QVariantAnimationPrivate *d;
  QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
  *in_stack_00000020;
  bool in_stack_00000047;
  QVariantAnimationPrivate *in_stack_00000048;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QVariantAnimation *)0x68f019);
  if (in_ESI < 0) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)pQVar2 >> 0x20),in_stack_ffffffffffffffb8);
    QMessageLogger::warning
              (&local_28,"QVariantAnimation::setDuration: cannot set a negative duration");
  }
  else {
    QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper
              ((QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
                *)in_RDI);
    pVar1 = QPropertyData<int>::valueBypassingBindings(&(pQVar2->duration).super_QPropertyData<int>)
    ;
    if (pVar1 != in_ESI) {
      QPropertyData<int>::setValueBypassingBindings
                (&(pQVar2->duration).super_QPropertyData<int>,in_ESI);
      QVariantAnimationPrivate::recalculateCurrentInterval(in_stack_00000048,in_stack_00000047);
      QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
      ::notify(in_stack_00000020);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimation::setDuration(int msecs)
{
    Q_D(QVariantAnimation);
    if (msecs < 0) {
        qWarning("QVariantAnimation::setDuration: cannot set a negative duration");
        return;
    }
    d->duration.removeBindingUnlessInWrapper();
    if (d->duration.valueBypassingBindings() != msecs) {
        d->duration.setValueBypassingBindings(msecs);
        d->recalculateCurrentInterval();
        d->duration.notify();
    }
}